

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ffint_u_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  long lVar4;
  uint uVar5;
  float32 fVar6;
  float64 fVar7;
  long lVar8;
  float_status *status;
  uintptr_t unaff_retaddr;
  wr_t wx;
  float64 local_48 [3];
  
  lVar4 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = uint32_to_float32_mips64
                        (*(uint32_t *)((long)(env->active_fpu).fpr + lVar8 * 4 + lVar4 + -0x338),
                         pfVar2);
      *(float32 *)((long)local_48 + lVar8 * 4) = fVar6;
      uVar5 = update_msacsr(env,0,(uint)((fVar6 & 0x7f800000) == 0 && (fVar6 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
        fVar6 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_48 + lVar8 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar5;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1cf5,
                    "void helper_msa_ffint_u_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = uint64_to_float64_mips64
                        (*(uint64_t *)((long)(env->active_fpu).fpr + lVar8 * 8 + lVar4 + -0x338),
                         pfVar2);
      local_48[lVar8] = fVar7;
      uVar5 = update_msacsr(env,0,(uint)((fVar7 & 0x7ff0000000000000) == 0 &&
                                        (fVar7 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
        fVar7 = float64_default_nan_mips64(pfVar2);
        local_48[lVar8] = (long)(int)uVar5 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  check_msacsr_cause(env,unaff_retaddr);
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48[0];
  (&pfVar3->fd)[1] = local_48[1];
  return;
}

Assistant:

void helper_msa_ffint_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_uint32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_uint64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}